

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  char *key;
  long lVar1;
  char *str;
  uint uVar2;
  uint uVar3;
  size_t __n;
  ulong __size;
  
  uVar3 = 0x59;
  __n = 0;
  str = (char *)0x0;
  if (chunkLength == 0) {
    key = (char *)0x0;
  }
  else {
    do {
      if (data[__n] == '\0') break;
      __n = (size_t)((int)__n + 1);
    } while (__n < chunkLength);
    if ((int)__n - 0x50U < 0xffffffb1) {
      key = (char *)0x0;
      str = (char *)0x0;
    }
    else {
      uVar3 = (int)__n + 1;
      __size = (ulong)uVar3;
      key = (char *)malloc(__size);
      if (key == (char *)0x0) {
        key = (char *)0x0;
      }
      else {
        key[__n] = '\0';
        memcpy(key,data,__n);
        uVar2 = (int)chunkLength - uVar3;
        if (chunkLength < __size) {
          uVar2 = 0;
        }
        str = (char *)malloc((ulong)(uVar2 + 1));
        if (str != (char *)0x0) {
          str[uVar2] = '\0';
          if (__size < chunkLength) {
            lVar1 = 0;
            do {
              str[lVar1] = data[uVar3 + (int)lVar1];
              lVar1 = lVar1 + 1;
            } while (uVar2 != (uint)lVar1);
          }
          uVar3 = lodepng_add_text(info,key,str);
          goto LAB_00113ac3;
        }
      }
      str = (char *)0x0;
      uVar3 = 0x53;
    }
  }
LAB_00113ac3:
  free(key);
  free(str);
  return uVar3;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;
  unsigned i;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    str[length] = 0;
    for(i = 0; i != length; ++i) str[i] = (char)data[string2_begin + i];

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}